

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meaning.h
# Opt level: O0

void __thiscall SequenceMeaning::TracePointers(SequenceMeaning *this,function<void_(Sexp_**)> *func)

{
  bool bVar1;
  reference __args;
  Sexp **form;
  iterator __end1;
  iterator __begin1;
  vector<Sexp_*,_std::allocator<Sexp_*>_> *__range1;
  function<void_(Sexp_**)> *func_local;
  SequenceMeaning *this_local;
  
  __end1 = std::vector<Sexp_*,_std::allocator<Sexp_*>_>::begin(&this->body);
  form = (Sexp **)std::vector<Sexp_*,_std::allocator<Sexp_*>_>::end(&this->body);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Sexp_**,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_>
                                *)&form);
    if (!bVar1) break;
    __args = __gnu_cxx::__normal_iterator<Sexp_**,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_>::
             operator*(&__end1);
    std::function<void_(Sexp_**)>::operator()(func,__args);
    __gnu_cxx::__normal_iterator<Sexp_**,_std::vector<Sexp_*,_std::allocator<Sexp_*>_>_>::operator++
              (&__end1);
  }
  std::function<void_(Sexp_**)>::operator()(func,&this->final_form);
  return;
}

Assistant:

void TracePointers(std::function<void(Sexp **)> func) override {
    for (auto &form : body) {
      func(&form);
    }

    func(&final_form);
  }